

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb_newell_normal(float *normal,int num_vert,float **vert,int normalize)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  normal[2] = 0.0;
  normal[0] = 0.0;
  normal[1] = 0.0;
  iVar6 = num_vert + -1;
  uVar4 = 0;
  uVar5 = (ulong)(uint)num_vert;
  if (num_vert < 1) {
    uVar5 = uVar4;
  }
  fVar7 = 0.0;
  fVar8 = 0.0;
  fVar9 = 0.0;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pfVar1 = vert[iVar6];
    pfVar2 = vert[uVar4];
    fVar9 = fVar9 + (pfVar1[2] + pfVar2[2]) * (pfVar1[1] - pfVar2[1]);
    *normal = fVar9;
    fVar8 = fVar8 + (*pfVar1 + *pfVar2) * (pfVar1[2] - pfVar2[2]);
    normal[1] = fVar8;
    fVar7 = fVar7 + (pfVar1[1] + pfVar2[1]) * (*pfVar1 - *pfVar2);
    normal[2] = fVar7;
    iVar6 = (int)uVar4;
  }
  if (normalize != 0) {
    fVar3 = 1.0 / SQRT(fVar7 * fVar7 + fVar9 * fVar9 + fVar8 * fVar8);
    *normal = fVar9 * fVar3;
    normal[1] = fVar8 * fVar3;
    normal[2] = fVar7 * fVar3;
  }
  return;
}

Assistant:

void stb_newell_normal(float *normal, int num_vert, float **vert, int normalize)
{
   int i,j;
   float p;
   normal[0] = normal[1] = normal[2] = 0;
   for (i=num_vert-1,j=0; j < num_vert; i=j++) {
      float *u = vert[i];
      float *v = vert[j];
      normal[0] += (u[1] - v[1]) * (u[2] + v[2]);
      normal[1] += (u[2] - v[2]) * (u[0] + v[0]);
      normal[2] += (u[0] - v[0]) * (u[1] + v[1]);
   }
   if (normalize) {
      p = normal[0]*normal[0] + normal[1]*normal[1] + normal[2]*normal[2];
      p = (float) (1.0 / sqrt(p));
      normal[0] *= p;
      normal[1] *= p;
      normal[2] *= p;
   }
}